

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::dxt_hc::alpha_cluster>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  alpha_cluster *paVar1;
  uint in_EDX;
  alpha_cluster *in_RSI;
  alpha_cluster *pDst;
  alpha_cluster *pSrc_end;
  alpha_cluster *pSrc;
  undefined4 in_stack_00000020;
  
  paVar1 = in_RSI + in_EDX;
  for (; in_RSI != paVar1; in_RSI = in_RSI + 1) {
    dxt_hc::alpha_cluster::alpha_cluster((alpha_cluster *)CONCAT44(num,in_stack_00000020),pSrc);
    dxt_hc::alpha_cluster::~alpha_cluster(in_RSI);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }